

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O2

void defyx_release_cache(defyx_cache *cache)

{
  (*cache->dealloc)(cache);
  defyx_cache::~defyx_cache(cache);
  operator_delete(cache);
  return;
}

Assistant:

void defyx_release_cache(defyx_cache* cache) {
		assert(cache != nullptr);
		cache->dealloc(cache);
		delete cache;
	}